

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_read_ns(BitReadCtx_t *gbc,char *name,RK_U32 n,RK_U32 *write_to)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  uint uVar4;
  uint uVar5;
  RK_S32 _out_1;
  RK_S32 _out;
  undefined8 local_38;
  
  local_38 = in_RAX;
  RVar1 = mpp_log2(n);
  RVar2 = mpp_get_bits_left(gbc);
  if (RVar1 < RVar2) {
    if (RVar1 < 1) {
      uVar5 = 0;
    }
    else {
      MVar3 = mpp_read_bits(gbc,RVar1,(RK_S32 *)((long)&local_38 + 4));
      gbc->ret = MVar3;
      if (MVar3 != MPP_OK) {
        return -1;
      }
      uVar5 = local_38._4_4_;
    }
    uVar4 = (1 << ((char)RVar1 + 1U & 0x1f)) - n;
    if (uVar4 <= uVar5) {
      MVar3 = mpp_read_bits(gbc,1,(RK_S32 *)&local_38);
      gbc->ret = MVar3;
      if (MVar3 != MPP_OK) {
        return -1;
      }
      uVar5 = (uVar5 * 2 - uVar4) + (int)local_38;
    }
    *write_to = uVar5;
    RVar1 = 0;
  }
  else {
    _mpp_log_l(2,"av1d_cbs","Invalid non-symmetric value at %s: bitstream ended.\n",
               "mpp_av1_read_ns",name);
    RVar1 = -1;
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_read_ns(BitReadCtx_t *gbc, const char *name,
                              RK_U32 n, RK_U32 *write_to)
{
    RK_U32 m, v, extra_bit, value;
    RK_S32 w;

    w = mpp_log2(n) + 1;
    m = (1 << w) - n;

    if (mpp_get_bits_left(gbc) < w) {
        mpp_err_f("Invalid non-symmetric value at "
                  "%s: bitstream ended.\n", name);
        return MPP_NOK;
    }
    if (w - 1 > 0)
        READ_BITS(gbc, w - 1, &v);
    else
        v = 0;

    if (v < m) {
        value = v;
    } else {
        READ_ONEBIT(gbc, &extra_bit);
        value = (v << 1) - m + extra_bit;
    }

    *write_to = value;
    return MPP_OK;

__bitread_error:
    return MPP_NOK;

}